

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

double __thiscall Mat::NormInf(Mat *this)

{
  int i;
  long lVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = ABS(*this->v_);
  for (lVar1 = 1; lVar1 < (long)this->n_cols_ * (long)this->n_rows_; lVar1 = lVar1 + 1) {
    dVar3 = ABS(this->v_[lVar1]);
    if (dVar3 <= dVar2) {
      dVar3 = dVar2;
    }
    dVar2 = dVar3;
  }
  return dVar2;
}

Assistant:

double Mat::NormInf()
{	
	double output = abs(v_[0]);	
	for (int i = 1; i < Size(); i++)
		output = output<abs(v_[i]) ? output=abs (v_[i]):output;
	return output;
}